

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::FileDescriptor::CopyTo(FileDescriptor *this,FileDescriptorProto *proto)

{
  int *piVar1;
  byte *pbVar2;
  int iVar3;
  int iVar4;
  void **ppvVar5;
  long lVar6;
  string *psVar7;
  DescriptorProto *proto_00;
  EnumDescriptorProto *proto_01;
  ServiceDescriptorProto *proto_02;
  FieldDescriptorProto *proto_03;
  FileOptions *pFVar8;
  FileOptions *pFVar9;
  long lVar10;
  long lVar11;
  
  proto->_has_bits_[0] = proto->_has_bits_[0] | 1;
  if (proto->name_ == (string *)internal::kEmptyString_abi_cxx11_) {
    psVar7 = (string *)operator_new(0x20);
    (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
    psVar7->_M_string_length = 0;
    (psVar7->field_2)._M_local_buf[0] = '\0';
    proto->name_ = psVar7;
  }
  std::__cxx11::string::_M_assign((string *)proto->name_);
  if (*(long *)(*(long *)(this + 8) + 8) != 0) {
    *(byte *)proto->_has_bits_ = (byte)proto->_has_bits_[0] | 2;
    if (proto->package_ == (string *)internal::kEmptyString_abi_cxx11_) {
      psVar7 = (string *)operator_new(0x20);
      (psVar7->_M_dataplus)._M_p = (pointer)&psVar7->field_2;
      psVar7->_M_string_length = 0;
      (psVar7->field_2)._M_local_buf[0] = '\0';
      proto->package_ = psVar7;
    }
    std::__cxx11::string::_M_assign((string *)proto->package_);
  }
  if (0 < *(int *)(this + 0x18)) {
    lVar10 = 0;
    do {
      iVar3 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (proto->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (proto->dependency_).super_RepeatedPtrFieldBase.elements_;
        (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        psVar7 = (string *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (proto->dependency_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->dependency_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(proto->dependency_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        psVar7 = internal::StringTypeHandlerBase::New_abi_cxx11_();
        ppvVar5 = (proto->dependency_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (proto->dependency_).super_RepeatedPtrFieldBase.current_size_;
        (proto->dependency_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = psVar7;
      }
      std::__cxx11::string::_M_assign((string *)psVar7);
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this + 0x18));
  }
  if (0 < *(int *)(this + 0x28)) {
    lVar10 = 0;
    do {
      iVar3 = *(int *)(*(long *)(this + 0x30) + lVar10 * 4);
      iVar4 = (proto->public_dependency_).total_size_;
      if ((proto->public_dependency_).current_size_ == iVar4) {
        RepeatedField<int>::Reserve(&proto->public_dependency_,iVar4 + 1);
      }
      iVar4 = (proto->public_dependency_).current_size_;
      (proto->public_dependency_).current_size_ = iVar4 + 1;
      (proto->public_dependency_).elements_[iVar4] = iVar3;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this + 0x28));
  }
  if (0 < *(int *)(this + 0x38)) {
    lVar10 = 0;
    do {
      iVar3 = *(int *)(*(long *)(this + 0x40) + lVar10 * 4);
      iVar4 = (proto->weak_dependency_).total_size_;
      if ((proto->weak_dependency_).current_size_ == iVar4) {
        RepeatedField<int>::Reserve(&proto->weak_dependency_,iVar4 + 1);
      }
      iVar4 = (proto->weak_dependency_).current_size_;
      (proto->weak_dependency_).current_size_ = iVar4 + 1;
      (proto->weak_dependency_).elements_[iVar4] = iVar3;
      lVar10 = lVar10 + 1;
    } while (lVar10 < *(int *)(this + 0x38));
  }
  if (0 < *(int *)(this + 0x48)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar6 = *(long *)(this + 0x50);
      iVar3 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (proto->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (proto->message_type_).super_RepeatedPtrFieldBase.elements_;
        (proto->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        proto_00 = (DescriptorProto *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (proto->message_type_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->message_type_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(proto->message_type_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        proto_00 = internal::GenericTypeHandler<google::protobuf::DescriptorProto>::New();
        ppvVar5 = (proto->message_type_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (proto->message_type_).super_RepeatedPtrFieldBase.current_size_;
        (proto->message_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = proto_00;
      }
      Descriptor::CopyTo((Descriptor *)(lVar6 + lVar11),proto_00);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x78;
    } while (lVar10 < *(int *)(this + 0x48));
  }
  if (0 < *(int *)(this + 0x58)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar6 = *(long *)(this + 0x60);
      iVar3 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (proto->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (proto->enum_type_).super_RepeatedPtrFieldBase.elements_;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        proto_01 = (EnumDescriptorProto *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (proto->enum_type_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->enum_type_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(proto->enum_type_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        proto_01 = internal::GenericTypeHandler<google::protobuf::EnumDescriptorProto>::New();
        ppvVar5 = (proto->enum_type_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_;
        (proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = proto_01;
      }
      EnumDescriptor::CopyTo((EnumDescriptor *)(lVar6 + lVar11),proto_01);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x38;
    } while (lVar10 < *(int *)(this + 0x58));
  }
  if (0 < *(int *)(this + 0x68)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar6 = *(long *)(this + 0x70);
      iVar3 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (proto->service_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (proto->service_).super_RepeatedPtrFieldBase.elements_;
        (proto->service_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        proto_02 = (ServiceDescriptorProto *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (proto->service_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->service_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(proto->service_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        proto_02 = internal::GenericTypeHandler<google::protobuf::ServiceDescriptorProto>::New();
        ppvVar5 = (proto->service_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (proto->service_).super_RepeatedPtrFieldBase.current_size_;
        (proto->service_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = proto_02;
      }
      ServiceDescriptor::CopyTo((ServiceDescriptor *)(lVar6 + lVar11),proto_02);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x30;
    } while (lVar10 < *(int *)(this + 0x68));
  }
  if (0 < *(int *)(this + 0x78)) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      lVar6 = *(long *)(this + 0x80);
      iVar3 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
      iVar4 = (proto->extension_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar3 < iVar4) {
        ppvVar5 = (proto->extension_).super_RepeatedPtrFieldBase.elements_;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        proto_03 = (FieldDescriptorProto *)ppvVar5[iVar3];
      }
      else {
        iVar3 = (proto->extension_).super_RepeatedPtrFieldBase.total_size_;
        if (iVar4 == iVar3) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(proto->extension_).super_RepeatedPtrFieldBase,iVar3 + 1);
        }
        piVar1 = &(proto->extension_).super_RepeatedPtrFieldBase.allocated_size_;
        *piVar1 = *piVar1 + 1;
        proto_03 = internal::GenericTypeHandler<google::protobuf::FieldDescriptorProto>::New();
        ppvVar5 = (proto->extension_).super_RepeatedPtrFieldBase.elements_;
        iVar3 = (proto->extension_).super_RepeatedPtrFieldBase.current_size_;
        (proto->extension_).super_RepeatedPtrFieldBase.current_size_ = iVar3 + 1;
        ppvVar5[iVar3] = proto_03;
      }
      FieldDescriptor::CopyTo((FieldDescriptor *)(lVar6 + lVar11),proto_03);
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x78;
    } while (lVar10 < *(int *)(this + 0x78));
  }
  pFVar9 = *(FileOptions **)(this + 0x88);
  pFVar8 = FileOptions::default_instance();
  if (pFVar9 != pFVar8) {
    pbVar2 = (byte *)((long)proto->_has_bits_ + 1);
    *pbVar2 = *pbVar2 | 2;
    if (proto->options_ == (FileOptions *)0x0) {
      pFVar9 = (FileOptions *)operator_new(0x88);
      FileOptions::FileOptions(pFVar9);
      proto->options_ = pFVar9;
    }
    FileOptions::CopyFrom(proto->options_,*(FileOptions **)(this + 0x88));
    return;
  }
  return;
}

Assistant:

void FileDescriptor::CopyTo(FileDescriptorProto* proto) const {
  proto->set_name(name());
  if (!package().empty()) proto->set_package(package());

  for (int i = 0; i < dependency_count(); i++) {
    proto->add_dependency(dependency(i)->name());
  }

  for (int i = 0; i < public_dependency_count(); i++) {
    proto->add_public_dependency(public_dependencies_[i]);
  }

  for (int i = 0; i < weak_dependency_count(); i++) {
    proto->add_weak_dependency(weak_dependencies_[i]);
  }

  for (int i = 0; i < message_type_count(); i++) {
    message_type(i)->CopyTo(proto->add_message_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < service_count(); i++) {
    service(i)->CopyTo(proto->add_service());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }

  if (&options() != &FileOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}